

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O0

void __thiscall ui::GPIOImpl::BuildUI(GPIOImpl *this)

{
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  bool bVar1;
  directory_entry *this_00;
  path *this_01;
  long lVar2;
  element_type *this_02;
  element_type *this_03;
  ConstStringListRef entries;
  shared_ptr<ftxui::ComponentBase> *local_4a0;
  allocator<std::shared_ptr<ftxui::ComponentBase>_> local_441;
  undefined1 local_440 [32];
  shared_ptr<ftxui::ComponentBase> local_420;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_410;
  Component local_3f8;
  shared_ptr<ftxui::ComponentBase> local_3e8;
  string local_3d8;
  int *local_3b8;
  int *local_3b0;
  int *local_3a8;
  undefined1 local_3a0 [8];
  shared_ptr<ui::Gpio> gpio;
  string gpio_path;
  directory_entry *it;
  undefined1 local_358 [8];
  directory_iterator __end2;
  undefined1 local_338 [8];
  directory_iterator __begin2;
  directory_iterator local_300;
  directory_iterator *local_2f0;
  directory_iterator *__range2;
  pointer psStack_2e0;
  pointer local_2d8;
  shared_ptr<ftxui::ComponentBase> local_2d0;
  MenuOption local_2c0;
  Ref<ftxui::MenuOption> local_1f0;
  ConstStringListRef local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0 [8];
  MenuOption menuOpt;
  GPIOImpl *this_local;
  
  menuOpt.focused_entry.address_ = (int *)this;
  ftxui::MenuOption::MenuOption((MenuOption *)local_e0);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::function<void()>::operator=
            ((function<void()> *)&menuOpt.on_change._M_invoker,
             (anon_class_8_1_8991fb9c *)
             &local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ftxui::ConstStringListRef::ConstStringListRef(&local_108,&this->gpio_names);
  ftxui::MenuOption::MenuOption(&local_2c0,(MenuOption *)local_e0);
  ftxui::Ref<ftxui::MenuOption>::Ref(&local_1f0,&local_2c0);
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)local_108.ref_;
  entries.ref_ = &local_f8;
  ftxui::Menu(entries,(int *)local_108.ref_wide_,(Ref<ftxui::MenuOption> *)&this->selected);
  std::shared_ptr<ftxui::ComponentBase>::operator=
            (&this->gpio_menu,(shared_ptr<ftxui::ComponentBase> *)&local_f8);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr((shared_ptr<ftxui::ComponentBase> *)&local_f8);
  ftxui::Ref<ftxui::MenuOption>::~Ref(&local_1f0);
  ftxui::MenuOption::~MenuOption(&local_2c0);
  __range2 = (directory_iterator *)0x0;
  psStack_2e0 = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
            *)&__range2);
  ftxui::Container::Vertical
            ((Container *)&local_2d0,
             (vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
              *)&__range2,&this->selected);
  std::shared_ptr<ftxui::ComponentBase>::operator=(&this->gpio_individual,&local_2d0);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_2d0);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector((vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             *)&__range2);
  std::filesystem::__cxx11::path::path<char[17],std::filesystem::__cxx11::path>
            ((path *)&__begin2._M_dir._M_refcount,(char (*) [17])"/sys/class/gpio/",auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_300,(path *)&__begin2._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin2._M_dir._M_refcount);
  local_2f0 = &local_300;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end2._M_dir._M_refcount,local_2f0);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_338,(directory_iterator *)&__end2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&it,local_2f0);
  std::filesystem::__cxx11::end((directory_iterator *)local_358);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&it);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)local_338,(directory_iterator *)local_358);
    if (!bVar1) break;
    this_00 = (directory_entry *)
              std::filesystem::__cxx11::directory_iterator::operator*
                        ((directory_iterator *)local_338);
    this_01 = std::filesystem::__cxx11::directory_entry::path(this_00);
    std::filesystem::__cxx11::path::operator_cast_to_string
              ((string_type *)
               &gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this_01);
    lVar2 = std::__cxx11::string::find
                      ((char *)&gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,0x1c24be);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find
                        ((char *)&gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,0x1c24c7);
      if (lVar2 != -1) {
        local_3a8 = &this->tab;
        local_3b0 = &this->selected;
        local_3b8 = &this->limit;
        std::make_shared<ui::Gpio,std::__cxx11::string&,int*,int*,int*>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                   (int **)&gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&local_3a8,&local_3b0);
        this_02 = std::__shared_ptr_access<ui::Gpio,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<ui::Gpio,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3a0);
        Gpio::label_abi_cxx11_(&local_3d8,this_02);
        lVar2 = std::__cxx11::string::find((char *)&local_3d8,0x1c53ff);
        std::__cxx11::string::~string((string *)&local_3d8);
        if (lVar2 != -1) {
          std::vector<std::shared_ptr<ui::Gpio>,_std::allocator<std::shared_ptr<ui::Gpio>_>_>::
          push_back(&this->children_,(value_type *)local_3a0);
          this_03 = std::
                    __shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->gpio_individual);
          std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ui::Gpio,void>
                    (&local_3e8,(shared_ptr<ui::Gpio> *)local_3a0);
          ftxui::ComponentBase::Add(this_03,&local_3e8);
          std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_3e8);
          this->limit = this->limit + 1;
        }
        std::shared_ptr<ui::Gpio>::~shared_ptr((shared_ptr<ui::Gpio> *)local_3a0);
      }
    }
    std::__cxx11::string::~string
              ((string *)&gpio.super___shared_ptr<ui::Gpio,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_338);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_358)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_338)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_300);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)local_440,&this->gpio_menu);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)(local_440 + 0x10),&this->gpio_individual);
  local_420.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_420.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_440;
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::allocator(&local_441);
  __l._M_len = (size_type)
               local_420.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_420.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_410,__l,&local_441);
  ftxui::Container::Tab((Container *)&local_3f8,&local_410,&this->tab);
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_3f8);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_3f8);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_410);
  std::allocator<std::shared_ptr<ftxui::ComponentBase>_>::~allocator(&local_441);
  local_4a0 = &local_420;
  do {
    local_4a0 = local_4a0 + -1;
    std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(local_4a0);
  } while (local_4a0 != (shared_ptr<ftxui::ComponentBase> *)local_440);
  ftxui::MenuOption::~MenuOption((MenuOption *)local_e0);
  return;
}

Assistant:

void BuildUI() {
    MenuOption menuOpt;
    menuOpt.on_enter = [&] { tab = 1; };
    gpio_menu = Menu(&gpio_names, &selected, menuOpt);
    gpio_individual = Container::Vertical({}, &selected);
    for (const auto& it :
         std::filesystem::directory_iterator("/sys/class/gpio/")) {
      std::string gpio_path = it.path();
      if (gpio_path.find("gpiochip") == std::string::npos &&
          gpio_path.find("gpio") != std::string::npos) {
        auto gpio = std::make_shared<Gpio>(gpio_path, &tab, &selected, &limit);
        if (gpio->label().find("P") != std::string::npos) {
          children_.push_back(gpio);
          gpio_individual->Add(gpio);
          limit++;
        }
      }
    }

    Add(Container::Tab(
        {
            gpio_menu,
            gpio_individual,
        },
        &tab));
  }